

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

void Gia_ManDumpTests(Vec_Int_t *vTests,int nIter,char *pFileName)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  __stream = fopen(pFileName,"wb");
  iVar1 = vTests->nSize / nIter;
  if (vTests->nSize % nIter != 0) {
    __assert_fail("Vec_IntSize(vTests) % nIter == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x3b7,"void Gia_ManDumpTests(Vec_Int_t *, int, char *)");
  }
  if (0 < nIter) {
    iVar2 = 0;
    if (0 < iVar1) {
      iVar2 = iVar1;
    }
    uVar3 = 0;
    iVar5 = 0;
    do {
      if (0 < iVar1) {
        uVar6 = (ulong)uVar3;
        iVar4 = 0;
        do {
          if (((int)uVar3 < 0) || (vTests->nSize <= (int)(uVar3 + iVar4))) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          fprintf(__stream,"%d",(ulong)(uint)vTests->pArray[uVar6]);
          iVar4 = iVar4 + 1;
          uVar6 = uVar6 + 1;
        } while (iVar1 != iVar4);
      }
      iVar5 = iVar5 + 1;
      fputc(10,__stream);
      uVar3 = uVar3 + iVar2;
    } while (iVar5 != nIter);
  }
  fclose(__stream);
  return;
}

Assistant:

void Gia_ManDumpTests( Vec_Int_t * vTests, int nIter, char * pFileName )
{
    FILE * pFile = fopen( pFileName, "wb" );
    int i, k, v, nVars = Vec_IntSize(vTests) / nIter;
    assert( Vec_IntSize(vTests) % nIter == 0 );
    for ( v = i = 0; i < nIter; i++, fprintf(pFile, "\n") )
        for ( k = 0; k < nVars; k++ )
            fprintf( pFile, "%d", Vec_IntEntry(vTests, v++) );
    fclose( pFile );
}